

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CX<float>::CX(CX<float> *this,int control,int target,int controlState)

{
  int controlState_local;
  int target_local;
  int control_local;
  CX<float> *this_local;
  
  QControlledGate2<float>::QControlledGate2
            (&this->super_QControlledGate2<float>,control,controlState);
  (this->super_QControlledGate2<float>).super_QGate2<float>.super_QObject<float>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00159858;
  std::make_unique<qclab::qgates::PauliX<float>,int_const&>((int *)&this->gate_);
  if (control < 0) {
    __assert_fail("control >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CX.hpp"
                  ,0x2b,"qclab::qgates::CX<float>::CX(const int, const int, const int) [T = float]")
    ;
  }
  if (-1 < target) {
    if (control != target) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CX.hpp"
                  ,0x2c,"qclab::qgates::CX<float>::CX(const int, const int, const int) [T = float]")
    ;
  }
  __assert_fail("target >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CX.hpp"
                ,0x2b,"qclab::qgates::CX<float>::CX(const int, const int, const int) [T = float]");
}

Assistant:

CX( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliX< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }